

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheFunction.hpp
# Opt level: O0

uint32_t __thiscall
CacheFunction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/tests/CacheFunctionTest.cpp:26:12),_std::function<double_(double)>_>
::inspect(CacheFunction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_libKriging[P]libKriging_tests_CacheFunctionTest_cpp:26:12),_std::function<double_(double)>_>
          *this,double args)

{
  bool bVar1;
  pointer ppVar2;
  iterator finder;
  HashKey arg_key;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint32_t uVar3;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false> in_stack_ffffffffffffffd8
  ;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false> in_stack_ffffffffffffffe0
  ;
  
  hash_args((CacheFunction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_libKriging[P]libKriging_tests_CacheFunctionTest_cpp:26:12),_std::function<double_(double)>_>
             *)in_stack_ffffffffffffffe0._M_cur,(double)in_stack_ffffffffffffffd8._M_cur);
  Catch::clara::std::
  unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  ::find((unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
          *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),(key_type *)0x15aeb8);
  Catch::clara::std::
  unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  ::end((unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
         *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  bVar1 = Catch::clara::std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false> *)
                     &stack0xffffffffffffffe0,
                     (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false> *)
                     &stack0xffffffffffffffd8);
  if (bVar1) {
    uVar3 = 0;
  }
  else {
    ppVar2 = Catch::clara::std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_unsigned_int>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_unsigned_long,_unsigned_int>,_false,_false>
                         *)0x15aef3);
    uVar3 = ppVar2->second;
  }
  return uVar3;
}

Assistant:

auto inspect(Args... args) -> uint32_t {
    const auto arg_key = hash_args(args...);
    const auto finder = m_cache_hit.find(arg_key);
    return (finder == m_cache_hit.end()) ? 0 : finder->second;
  }